

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode.c
# Opt level: O0

uint8_t sysbvm_bytecodeInterpreter_destinationOperandCountForOpcode(uint8_t opcode)

{
  uint8_t local_9;
  uint8_t opcode_local;
  
  switch(opcode) {
  case ' ':
  case '!':
  case '\"':
  case '#':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '6':
  case '7':
  case '9':
  case ':':
  case '@':
  case 'P':
  case '`':
  case 'p':
  case 0x80:
  case 0x90:
  case 0xa0:
  case 0xb0:
  case 0xc0:
    local_9 = '\x01';
    break;
  default:
    local_9 = '\0';
  }
  return local_9;
}

Assistant:

SYSBVM_API uint8_t sysbvm_bytecodeInterpreter_destinationOperandCountForOpcode(uint8_t opcode)
{
    switch(opcode)
    {
    case SYSBVM_OPCODE_ALLOCA:
    case SYSBVM_OPCODE_MOVE:
    case SYSBVM_OPCODE_LOAD:
    case SYSBVM_OPCODE_LOAD_SYMBOL_VALUE_BINDING:
    case SYSBVM_OPCODE_ALLOCA_WITH_VALUE:
    case SYSBVM_OPCODE_COERCE_VALUE:
    case SYSBVM_OPCODE_DOWNCAST_VALUE:
    case SYSBVM_OPCODE_UNCHECKED_DOWNCAST_VALUE:
    case SYSBVM_OPCODE_MAKE_ASSOCIATION:
    case SYSBVM_OPCODE_SLOT_AT:
    case SYSBVM_OPCODE_SLOT_REFERENCE_AT:
    case SYSBVM_OPCODE_REF_SLOT_AT:
    case SYSBVM_OPCODE_REF_SLOT_REFERENCE_AT:
    case SYSBVM_OPCODE_CALL:
    case SYSBVM_OPCODE_UNCHECKED_CALL:
    case SYSBVM_OPCODE_SEND:
    case SYSBVM_OPCODE_SEND_WITH_LOOKUP:
    case SYSBVM_OPCODE_MAKE_ARRAY_WITH_ELEMENTS:
    case SYSBVM_OPCODE_MAKE_BYTE_ARRAY_WITH_ELEMENTS:
    case SYSBVM_OPCODE_MAKE_CLOSURE_WITH_CAPTURES:
    case SYSBVM_OPCODE_MAKE_DICTIONARY_WITH_ELEMENTS:
    case SYSBVM_OPCODE_MAKE_TUPLE_WITH_ELEMENTS:
        return 1;
    default:
        return 0;
    }
}